

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O2

ErrCode __thiscall HttpHeaderBase::getFieldInt64(HttpHeaderBase *this,FieldType type,int64_t *value)

{
  char *__nptr;
  longlong lVar1;
  
  __nptr = getField(this,type);
  if (__nptr == (char *)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = strtoll(__nptr,(char **)0x0,0);
  }
  *value = lVar1;
  return (uint)(__nptr == (char *)0x0);
}

Assistant:

ErrCode HttpHeaderBase::getFieldInt64(FieldMap::FieldType type,
									  int64_t &value) const
{
	const char *str = getField(type);
	
	if (str != NULL)
	{
		value = strtoll(str, NULL, 0);
		return kNoError;
	}
	
	value = 0;
	return kNotFound;
}